

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

void __thiscall
hrgls::StreamProperties::StreamProperties(StreamProperties *this,StreamProperties *copy)

{
  StreamProperties_private *this_00;
  element_type *peVar1;
  element_type *this_01;
  StreamProperties *copy_local;
  StreamProperties *this_local;
  
  std::shared_ptr<hrgls::StreamProperties::StreamProperties_private>::shared_ptr(&this->m_private);
  this_00 = (StreamProperties_private *)operator_new(0x40);
  (this_00->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->m_status)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->m_status)._M_t._M_impl = 0;
  *(undefined8 *)&(this_00->m_status)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this_00->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  StreamProperties_private::StreamProperties_private(this_00);
  std::__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>::
  reset<hrgls::StreamProperties::StreamProperties_private>
            ((__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
              *)this,this_00);
  peVar1 = std::
           __shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)copy);
  this_01 = std::
            __shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  StreamProperties_private::operator=(this_01,peVar1);
  return;
}

Assistant:

StreamProperties::StreamProperties(const StreamProperties& copy)
  {
    m_private.reset(new StreamProperties_private());
    *m_private = *copy.m_private;
  }